

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

bool __thiscall
absl::time_internal::cctz::TimeZoneInfo::ResetToBuiltinUTC(TimeZoneInfo *this,seconds *offset)

{
  vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
  *this_00;
  TransitionType *tt;
  undefined1 uVar1;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  pointer pTVar2;
  pointer pTVar3;
  int_fast64_t unix_time;
  undefined3 uVar8;
  iterator iVar9;
  TransitionType *n;
  seconds *extraout_RDX;
  long lVar10;
  fields fVar11;
  civil_time<absl::time_internal::cctz::detail::second_tag> a;
  absolute_lookup local_50;
  seconds *offset_00;
  
  std::
  vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
  ::resize(&this->transition_types_,1);
  pTVar2 = (this->transition_types_).
           super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar2[-1].utc_offset = (int_least32_t)offset->__r;
  pTVar2[-1].is_dst = false;
  pTVar2[-1].abbr_index = '\0';
  this_00 = &this->transitions_;
  pTVar3 = (this->transitions_).
           super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->transitions_).
      super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
      ._M_impl.super__Vector_impl_data._M_finish != pTVar3) {
    (this->transitions_).
    super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar3;
  }
  tt = pTVar2 + -1;
  std::
  vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
  ::reserve(this_00,0xc);
  offset_00 = extraout_RDX;
  for (lVar10 = 0; lVar10 != 0x60; lVar10 = lVar10 + 8) {
    unix_time = *(int_fast64_t *)((long)&DAT_0015be80 + lVar10);
    iVar9 = std::
            vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
            ::_M_emplace_aux<>(this_00,(this->transitions_).
                                       super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
    (iVar9._M_current)->unix_time = unix_time;
    (iVar9._M_current)->type_index = '\0';
    n = tt;
    LocalTime(&local_50,this,unix_time,tt);
    ((iVar9._M_current)->civil_sec).f_.y = local_50.cs.f_.y;
    ((iVar9._M_current)->civil_sec).f_.m = local_50.cs.f_.m;
    ((iVar9._M_current)->civil_sec).f_.d = local_50.cs.f_.d;
    ((iVar9._M_current)->civil_sec).f_.hh = local_50.cs.f_.hh;
    ((iVar9._M_current)->civil_sec).f_.mm = local_50.cs.f_.mm;
    ((iVar9._M_current)->civil_sec).f_.ss = local_50.cs.f_.ss;
    *(undefined3 *)&((iVar9._M_current)->civil_sec).f_.field_0xd = local_50.cs.f_._13_3_;
    uVar1 = ((iVar9._M_current)->civil_sec).f_.m;
    uVar4 = ((iVar9._M_current)->civil_sec).f_.d;
    uVar5 = ((iVar9._M_current)->civil_sec).f_.hh;
    uVar6 = ((iVar9._M_current)->civil_sec).f_.mm;
    uVar7 = ((iVar9._M_current)->civil_sec).f_.ss;
    uVar8 = *(undefined3 *)&((iVar9._M_current)->civil_sec).f_.field_0xd;
    a.f_.y._5_3_ = uVar8;
    a.f_.y._4_1_ = uVar7;
    a.f_.y._3_1_ = uVar6;
    a.f_.y._2_1_ = uVar5;
    a.f_.y._1_1_ = uVar4;
    a.f_.y._0_1_ = uVar1;
    a.f_.m = '\x01';
    a.f_.d = '\0';
    a.f_.hh = '\0';
    a.f_.mm = '\0';
    a.f_.ss = '\0';
    a.f_._13_3_ = 0;
    fVar11 = (fields)detail::operator-((detail *)((iVar9._M_current)->civil_sec).f_.y,a,(diff_t)n);
    offset_00 = fVar11._8_8_;
    ((iVar9._M_current)->prev_civil_sec).f_ = fVar11;
  }
  this->default_transition_type_ = '\0';
  FixedOffsetToAbbr_abi_cxx11_((string *)&local_50,(cctz *)offset,offset_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->abbreviations_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((ulong)&this->abbreviations_,'\x01');
  (this->future_spec_)._M_string_length = 0;
  *(this->future_spec_)._M_dataplus._M_p = '\0';
  this->extended_ = false;
  LocalTime(&local_50,this,0x7fffffffffffffff,tt);
  pTVar2[-1].civil_max.f_.y = local_50.cs.f_.y;
  pTVar2[-1].civil_max.f_.m = local_50.cs.f_.m;
  pTVar2[-1].civil_max.f_.d = local_50.cs.f_.d;
  pTVar2[-1].civil_max.f_.hh = local_50.cs.f_.hh;
  pTVar2[-1].civil_max.f_.mm = local_50.cs.f_.mm;
  pTVar2[-1].civil_max.f_.ss = local_50.cs.f_.ss;
  *(undefined3 *)&pTVar2[-1].civil_max.f_.field_0xd = local_50.cs.f_._13_3_;
  LocalTime(&local_50,this,-0x8000000000000000,tt);
  pTVar2[-1].civil_min.f_.y = local_50.cs.f_.y;
  pTVar2[-1].civil_min.f_.m = local_50.cs.f_.m;
  pTVar2[-1].civil_min.f_.d = local_50.cs.f_.d;
  pTVar2[-1].civil_min.f_.hh = local_50.cs.f_.hh;
  pTVar2[-1].civil_min.f_.mm = local_50.cs.f_.mm;
  pTVar2[-1].civil_min.f_.ss = local_50.cs.f_.ss;
  *(undefined3 *)&pTVar2[-1].civil_min.f_.field_0xd = local_50.cs.f_._13_3_;
  std::
  vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
  ::_M_shrink_to_fit(this_00);
  return true;
}

Assistant:

bool TimeZoneInfo::ResetToBuiltinUTC(const seconds& offset) {
  transition_types_.resize(1);
  TransitionType& tt(transition_types_.back());
  tt.utc_offset = static_cast<std::int_least32_t>(offset.count());
  tt.is_dst = false;
  tt.abbr_index = 0;

  // We temporarily add some redundant, contemporary (2015 through 2025)
  // transitions for performance reasons.  See TimeZoneInfo::LocalTime().
  // TODO: Fix the performance issue and remove the extra transitions.
  transitions_.clear();
  transitions_.reserve(12);
  for (const std::int_fast64_t unix_time : {
           -(1LL << 59),  // a "first half" transition
           1420070400LL,  // 2015-01-01T00:00:00+00:00
           1451606400LL,  // 2016-01-01T00:00:00+00:00
           1483228800LL,  // 2017-01-01T00:00:00+00:00
           1514764800LL,  // 2018-01-01T00:00:00+00:00
           1546300800LL,  // 2019-01-01T00:00:00+00:00
           1577836800LL,  // 2020-01-01T00:00:00+00:00
           1609459200LL,  // 2021-01-01T00:00:00+00:00
           1640995200LL,  // 2022-01-01T00:00:00+00:00
           1672531200LL,  // 2023-01-01T00:00:00+00:00
           1704067200LL,  // 2024-01-01T00:00:00+00:00
           1735689600LL,  // 2025-01-01T00:00:00+00:00
       }) {
    Transition& tr(*transitions_.emplace(transitions_.end()));
    tr.unix_time = unix_time;
    tr.type_index = 0;
    tr.civil_sec = LocalTime(tr.unix_time, tt).cs;
    tr.prev_civil_sec = tr.civil_sec - 1;
  }

  default_transition_type_ = 0;
  abbreviations_ = FixedOffsetToAbbr(offset);
  abbreviations_.append(1, '\0');
  future_spec_.clear();  // never needed for a fixed-offset zone
  extended_ = false;

  tt.civil_max = LocalTime(seconds::max().count(), tt).cs;
  tt.civil_min = LocalTime(seconds::min().count(), tt).cs;

  transitions_.shrink_to_fit();
  return true;
}